

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O0

void literal(lzma_coder_conflict9 *coder,lzma_mf *mf,uint32_t position)

{
  lzma_lzma_state local_38;
  lzma_lzma_state local_34;
  uint8_t match_byte;
  probability *subcoder;
  uint8_t cur_byte;
  uint32_t position_local;
  lzma_mf *mf_local;
  lzma_coder_conflict9 *coder_local;
  
  if (coder->state < STATE_LIT_MATCH) {
    rc_bittree(&coder->rc,
               coder->literal
               [((position & coder->literal_pos_mask) << ((byte)coder->literal_context_bits & 0x1f))
                + ((int)(uint)mf->buffer[(mf->read_pos - mf->read_ahead) - 1] >>
                  (8U - (char)coder->literal_context_bits & 0x1f))],8,
               (uint)mf->buffer[mf->read_pos - mf->read_ahead]);
  }
  else {
    literal_matched(&coder->rc,
                    coder->literal
                    [((position & coder->literal_pos_mask) <<
                     ((byte)coder->literal_context_bits & 0x1f)) +
                     ((int)(uint)mf->buffer[(mf->read_pos - mf->read_ahead) - 1] >>
                     (8U - (char)coder->literal_context_bits & 0x1f))],
                    (uint)mf->buffer[((mf->read_pos - coder->reps[0]) + -1) - mf->read_ahead],
                    (uint)mf->buffer[mf->read_pos - mf->read_ahead]);
  }
  if (coder->state < STATE_MATCH_LIT) {
    local_34 = STATE_LIT_LIT;
  }
  else {
    if (coder->state < STATE_NONLIT_MATCH) {
      local_38 = coder->state - STATE_SHORTREP_LIT_LIT;
    }
    else {
      local_38 = coder->state - STATE_SHORTREP_LIT;
    }
    local_34 = local_38;
  }
  coder->state = local_34;
  return;
}

Assistant:

static inline void
literal(lzma_coder *coder, lzma_mf *mf, uint32_t position)
{
	// Locate the literal byte to be encoded and the subcoder.
	const uint8_t cur_byte = mf->buffer[
			mf->read_pos - mf->read_ahead];
	probability *subcoder = literal_subcoder(coder->literal,
			coder->literal_context_bits, coder->literal_pos_mask,
			position, mf->buffer[mf->read_pos - mf->read_ahead - 1]);

	if (is_literal_state(coder->state)) {
		// Previous LZMA-symbol was a literal. Encode a normal
		// literal without a match byte.
		rc_bittree(&coder->rc, subcoder, 8, cur_byte);
	} else {
		// Previous LZMA-symbol was a match. Use the last byte of
		// the match as a "match byte". That is, compare the bits
		// of the current literal and the match byte.
		const uint8_t match_byte = mf->buffer[
				mf->read_pos - coder->reps[0] - 1
				- mf->read_ahead];
		literal_matched(&coder->rc, subcoder, match_byte, cur_byte);
	}

	update_literal(coder->state);
}